

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O1

Info * re2::Prefilter::Info::Quest(Info *a)

{
  Info *pIVar1;
  _Rb_tree_header *p_Var2;
  Prefilter *pPVar3;
  
  pIVar1 = (Info *)operator_new(0x40);
  p_Var2 = &(pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pIVar1->match_ = (Prefilter *)0x0;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar1->is_exact_ = false;
  pPVar3 = (Prefilter *)operator_new(0x38);
  (pPVar3->atom_)._M_dataplus._M_p = (pointer)&(pPVar3->atom_).field_2;
  (pPVar3->atom_)._M_string_length = 0;
  (pPVar3->atom_).field_2._M_local_buf[0] = '\0';
  pPVar3->op_ = ALL;
  pPVar3->subs_ = (vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)0x0;
  pIVar1->match_ = pPVar3;
  if (a != (Info *)0x0) {
    ~Info(a);
    operator_delete(a);
  }
  return pIVar1;
}

Assistant:

Prefilter::Info* Prefilter::Info::Quest(Info *a) {
  Info *ab = new Info();

  ab->is_exact_ = false;
  ab->match_ = new Prefilter(ALL);
  delete a;
  return ab;
}